

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeNext_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  long lVar1;
  Fts5ExprNode *pFVar2;
  int iVar3;
  long lVar4;
  
  lVar1 = pNode->iRowid;
  lVar4 = 0;
  while( true ) {
    if (pNode->nChild <= lVar4) {
      fts5ExprNodeTest_OR(pExpr,pNode);
      return 0;
    }
    pFVar2 = pNode->apChild[lVar4];
    if ((pFVar2->bEof == 0) &&
       (((pFVar2->iRowid == lVar1 ||
         ((bFromValid != 0 && (iVar3 = fts5RowidCmp(pExpr,pFVar2->iRowid,iFrom), iVar3 < 0)))) &&
        (iVar3 = (*pFVar2->xNext)(pExpr,pFVar2,bFromValid,iFrom), iVar3 != 0)))) break;
    lVar4 = lVar4 + 1;
  }
  pNode->bNomatch = 0;
  return iVar3;
}

Assistant:

static int fts5ExprNodeNext_OR(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int i;
  i64 iLast = pNode->iRowid;

  for(i=0; i<pNode->nChild; i++){
    Fts5ExprNode *p1 = pNode->apChild[i];
    assert( p1->bEof || fts5RowidCmp(pExpr, p1->iRowid, iLast)>=0 );
    if( p1->bEof==0 ){
      if( (p1->iRowid==iLast)
       || (bFromValid && fts5RowidCmp(pExpr, p1->iRowid, iFrom)<0)
      ){
        int rc = fts5ExprNodeNext(pExpr, p1, bFromValid, iFrom);
        if( rc!=SQLITE_OK ){
          pNode->bNomatch = 0;
          return rc;
        }
      }
    }
  }

  fts5ExprNodeTest_OR(pExpr, pNode);
  return SQLITE_OK;
}